

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_135799e::ResizeCspTest_TestResizeCspWorks_Test::TestBody
          (ResizeCspTest_TestResizeCspWorks_Test *this)

{
  EncoderTest *pEVar1;
  aom_img_fmt_t format;
  pointer pFVar2;
  bool bVar3;
  long lVar4;
  SEARCH_METHODS *message;
  AssertHelper local_90;
  AssertHelper local_88;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  aom_img_fmt_t image_formats [2];
  ResizingCspVideoSource video;
  
  image_formats[0] = AOM_IMG_FMT_I420;
  image_formats[1] = AOM_IMG_FMT_I444;
  pEVar1 = &(this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest;
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 8) {
      return;
    }
    format = *(aom_img_fmt_t *)((long)image_formats + lVar4);
    libaom_test::DummyVideoSource::DummyVideoSource(&video.super_DummyVideoSource);
    video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource =
         (_func_int **)&PTR__DummyVideoSource_00f369f8;
    libaom_test::DummyVideoSource::SetSize(&video.super_DummyVideoSource,0x140,0xf0);
    libaom_test::DummyVideoSource::SetImageFormat(&video.super_DummyVideoSource,format);
    video.super_DummyVideoSource.limit_ = 0x1e;
    (this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest.init_flags_ = 0x10000;
    (this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest.cfg_.rc_min_quantizer = 0x30;
    (this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest.cfg_.rc_max_quantizer = 0x30;
    (this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest.cfg_.g_lag_in_frames = 0;
    (this->super_ResizeCspTest).super_ResizeTest.super_EncoderTest.cfg_.g_profile =
         (uint)(format != AOM_IMG_FMT_I420);
    bVar3 = testing::internal::AlwaysTrue();
    if (!bVar3) break;
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video.super_DummyVideoSource);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 != false) break;
    local_90.data_ =
         (AssertHelperData *)
         ((long)(this->super_ResizeCspTest).super_ResizeTest.frame_info_list_.
                super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_ResizeCspTest).super_ResizeTest.frame_info_list_.
                super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4);
    local_88.data_._0_4_ = video.super_DummyVideoSource.limit_;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&gtest_fatal_failure_checker,"frame_info_list_.size()","video.limit()",
               (unsigned_long *)&local_90,(uint *)&local_88);
    if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
              _vptr_TestPartResultReporterInterface == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((undefined8 *)
          CONCAT71(gtest_fatal_failure_checker._9_7_,
                   gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(SEARCH_METHODS **)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                 ,0x458,(char *)message);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_90.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
      goto LAB_005f0a25;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
    pFVar2 = (this->super_ResizeCspTest).super_ResizeTest.frame_info_list_.
             super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->super_ResizeCspTest).super_ResizeTest.frame_info_list_.
        super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish != pFVar2) {
      (this->super_ResizeCspTest).super_ResizeTest.frame_info_list_.
      super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar2;
    }
    libaom_test::DummyVideoSource::~DummyVideoSource(&video.super_DummyVideoSource);
    lVar4 = lVar4 + 4;
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
             ,0x454,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_005f0a25:
  libaom_test::DummyVideoSource::~DummyVideoSource(&video.super_DummyVideoSource);
  return;
}

Assistant:

TEST_P(ResizeCspTest, TestResizeCspWorks) {
#endif
  const aom_img_fmt_t image_formats[] = { AOM_IMG_FMT_I420, AOM_IMG_FMT_I444 };
  for (const aom_img_fmt_t &img_format : image_formats) {
    ResizingCspVideoSource video(img_format);
    init_flags_ = AOM_CODEC_USE_PSNR;
    cfg_.rc_min_quantizer = cfg_.rc_max_quantizer = 48;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_profile = (img_format == AOM_IMG_FMT_I420) ? 0 : 1;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
    // Check we decoded the same number of frames as we attempted to encode
    ASSERT_EQ(frame_info_list_.size(), video.limit());
    frame_info_list_.clear();
#endif
  }
}